

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall
testing::internal::FunctionMockerBase<test_result_(fmt::v5::basic_string_view<wchar_t>)>::
~FunctionMockerBase(FunctionMockerBase<test_result_(fmt::v5::basic_string_view<wchar_t>)> *this)

{
  UntypedFunctionMockerBase *unaff_RBX;
  
  (this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_001d7fb8;
  MutexBase::Lock((MutexBase *)g_gmock_mutex);
  UntypedFunctionMockerBase::VerifyAndClearExpectationsLocked
            (&this->super_UntypedFunctionMockerBase);
  Mock::UnregisterLocked(unaff_RBX);
  (*(this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase[2])(this);
  MutexBase::Unlock((MutexBase *)g_gmock_mutex);
  (this->current_spec_).matchers_.f0_.super_MatcherBase<fmt::v5::basic_string_view<wchar_t>_>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001d4088;
  linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_>::~linked_ptr
            (&(this->current_spec_).matchers_.f0_.
              super_MatcherBase<fmt::v5::basic_string_view<wchar_t>_>.impl_);
  UntypedFunctionMockerBase::~UntypedFunctionMockerBase(&this->super_UntypedFunctionMockerBase);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    MutexLock l(&g_gmock_mutex);
    VerifyAndClearExpectationsLocked();
    Mock::UnregisterLocked(this);
    ClearDefaultActionsLocked();
  }